

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_merge_sort_tree.cpp
# Opt level: O1

idx_t __thiscall duckdb::WindowMergeSortTree::MeasurePayloadBlocks(WindowMergeSortTree *this)

{
  pointer puVar1;
  iterator iVar2;
  pointer pGVar3;
  reference this_00;
  pointer pSVar4;
  pointer pSVar5;
  pointer pRVar6;
  pointer pMVar7;
  reference this_01;
  pointer pMVar8;
  reference this_02;
  unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true> *block;
  pointer this_03;
  idx_t count;
  unsigned_long local_30;
  
  pGVar3 = unique_ptr<duckdb::GlobalSortState,_std::default_delete<duckdb::GlobalSortState>,_true>::
           operator->(&this->global_sort);
  this_00 = vector<duckdb::unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>,_true>
            ::operator[](&pGVar3->sorted_blocks,0);
  pSVar4 = unique_ptr<duckdb::SortedBlock,_std::default_delete<duckdb::SortedBlock>,_true>::
           operator->(this_00);
  pSVar5 = unique_ptr<duckdb::SortedData,_std::default_delete<duckdb::SortedData>,_true>::operator->
                     (&pSVar4->payload_data);
  local_30 = 0;
  this_03 = (pSVar5->data_blocks).
            super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            .
            super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (pSVar5->data_blocks).
           super_vector<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           .
           super__Vector_base<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (this_03 != puVar1) {
    do {
      iVar2._M_current =
           (this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
      if (iVar2._M_current ==
          (this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        ::std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->block_starts,iVar2,
                   &local_30);
      }
      else {
        *iVar2._M_current = local_30;
        (this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_finish = iVar2._M_current + 1;
      }
      pRVar6 = unique_ptr<duckdb::RowDataBlock,_std::default_delete<duckdb::RowDataBlock>,_true>::
               operator->(this_03);
      local_30 = local_30 + pRVar6->count;
      this_03 = this_03 + 1;
    } while (this_03 != puVar1);
  }
  iVar2._M_current =
       (this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    ::std::vector<unsigned_long,std::allocator<unsigned_long>>::_M_realloc_insert<unsigned_long&>
              ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->block_starts,iVar2,
               &local_30);
  }
  else {
    *iVar2._M_current = local_30;
    (this->block_starts).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = iVar2._M_current + 1;
  }
  if ((this->mst32).
      super_unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      ._M_t.
      super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>_>
      .
      super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_*,_false>
      ._M_head_impl ==
      (MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL> *)0x0) {
    if ((this->mst64).
        super_unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
        ._M_t.
        super___uniq_ptr_impl<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>_>
        .
        super__Head_base<0UL,_duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_*,_false>
        ._M_head_impl !=
        (MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL> *)0x0) {
      pMVar8 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
               ::operator->(&this->mst64);
      MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>::Allocate
                (pMVar8,local_30);
      pMVar8 = unique_ptr<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_long,_unsigned_long,_std::less<unsigned_long>,_32UL,_32UL>_>,_true>
               ::operator->(&this->mst64);
      this_02 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                ::operator[](&pMVar8->tree,0);
      ::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)this_02,local_30);
    }
  }
  else {
    pMVar7 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
             ::operator->(&this->mst32);
    MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>::Allocate
              (pMVar7,local_30);
    pMVar7 = unique_ptr<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>,_std::default_delete<duckdb::MergeSortTree<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_32UL,_32UL>_>,_true>
             ::operator->(&this->mst32);
    this_01 = vector<std::pair<duckdb::vector<unsigned_int,_true>,_duckdb::vector<unsigned_int,_true>_>,_true>
              ::operator[](&pMVar7->tree,0);
    ::std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)this_01,local_30);
  }
  return local_30;
}

Assistant:

idx_t WindowMergeSortTree::MeasurePayloadBlocks() {
	const auto &blocks = global_sort->sorted_blocks[0]->payload_data->data_blocks;
	idx_t count = 0;
	for (const auto &block : blocks) {
		block_starts.emplace_back(count);
		count += block->count;
	}
	block_starts.emplace_back(count);

	// Allocate the leaves.
	if (mst32) {
		mst32->Allocate(count);
		mst32->LowestLevel().resize(count);
	} else if (mst64) {
		mst64->Allocate(count);
		mst64->LowestLevel().resize(count);
	}

	return count;
}